

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIRToString.cpp
# Opt level: O0

string * __thiscall
OpenMPAtomicDefaultMemOrderClause::toString_abi_cxx11_
          (string *__return_storage_ptr__,OpenMPAtomicDefaultMemOrderClause *this)

{
  long lVar1;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  OpenMPAtomicDefaultMemOrderClauseKind local_54;
  undefined1 local_50 [4];
  OpenMPAtomicDefaultMemOrderClauseKind kind;
  string parameter_string;
  allocator<char> local_1a;
  byte local_19;
  OpenMPAtomicDefaultMemOrderClause *local_18;
  OpenMPAtomicDefaultMemOrderClause *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (OpenMPAtomicDefaultMemOrderClause *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"atomic_default_mem_order(",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  std::__cxx11::string::string((string *)local_50);
  local_54 = getKind(this);
  if (local_54 == OMPC_ATOMIC_DEFAULT_MEM_ORDER_seq_cst) {
    std::__cxx11::string::operator=((string *)local_50,"seq_cst");
  }
  else if (local_54 == OMPC_ATOMIC_DEFAULT_MEM_ORDER_acq_rel) {
    std::__cxx11::string::operator=((string *)local_50,"acq_rel");
  }
  else if (local_54 == OMPC_ATOMIC_DEFAULT_MEM_ORDER_relaxed) {
    std::__cxx11::string::operator=((string *)local_50,"relaxed");
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "The parameter of tomic_default_mem_order clause is not supported.\n");
  }
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_98,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_98);
    std::__cxx11::string::~string(local_98);
  }
  else {
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   ") ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  local_19 = 1;
  std::__cxx11::string::~string((string *)local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string OpenMPAtomicDefaultMemOrderClause::toString() {
    std::string result = "atomic_default_mem_order(";
    std::string parameter_string;
    OpenMPAtomicDefaultMemOrderClauseKind kind = this->getKind();
    switch (kind) {
        case OMPC_ATOMIC_DEFAULT_MEM_ORDER_seq_cst:
            parameter_string = "seq_cst";
            break;
        case OMPC_ATOMIC_DEFAULT_MEM_ORDER_acq_rel:
            parameter_string = "acq_rel";
            break;
        case OMPC_ATOMIC_DEFAULT_MEM_ORDER_relaxed:
            parameter_string = "relaxed";
            break;
        default:
            std::cout << "The parameter of tomic_default_mem_order clause is not supported.\n";
    };

    if (parameter_string.size() > 0) {
        result += parameter_string + ") ";
    }
    else {
        result = result.substr(0, result.size()-2);
    }

    return result;
}